

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::ExtrapolateCdf53(v3i *Dims3,u64 TransformOrder,volume *Vol)

{
  u64 uVar1;
  long lVar2;
  uint uVar3;
  uint NLevels;
  ulong uVar4;
  v3i M3;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_48;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_3c;
  
  uVar1 = Vol->Dims;
  uVar3 = (uint)((long)(uVar1 << 0x2b) >> 0x2b);
  uVar4 = (long)(uVar1 << 0x16) >> 0xb & 0xffffffff00000000;
  local_48.field_0.Z = (int)((long)(uVar1 * 2) >> 0x2b);
  local_3c.field_0.X = uVar3 - 1;
  if (uVar3 == 1) {
    local_3c.field_0.X = 1;
  }
  local_48.field_0.Y = (int)(uVar4 >> 0x20);
  local_3c.field_0.Y = local_48.field_0.Y - 1;
  if (local_48.field_0.Y == 1) {
    local_3c.field_0.Y = 1;
  }
  local_3c.field_0.Z = 1;
  if ((long)(uVar1 * 2) >> 0x2b != 1) {
    local_3c.field_0.Z = local_48.field_0.Z - 1;
  }
  if (local_48.field_0.Y < (int)uVar3) {
    local_48.field_0.Y = uVar3;
  }
  if (local_48.field_0.Y <= local_48.field_0.Z) {
    local_48.field_0.Y = local_48.field_0.Z;
  }
  lVar2 = 0x3f;
  if ((long)local_48.field_0.Y != 0) {
    for (; (ulong)(long)local_48.field_0.Y >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  NLevels = -(uint)(local_48.field_0.Y == 0) | (uint)lVar2;
  local_48.field_3.XY.field_0 = (v2<int>)(uVar4 | uVar3);
  ForwardCdf53(Dims3,(v3i *)&local_3c.field_0,0,NLevels,TransformOrder,Vol,false);
  InverseCdf53((v3i *)&local_48.field_0,(v3i *)&local_3c.field_0,0,NLevels,TransformOrder,Vol,false)
  ;
  return;
}

Assistant:

void
ExtrapolateCdf53(const v3i& Dims3, u64 TransformOrder, volume* Vol)
{
  v3i N3 = Dims(*Vol);
  v3i M3(N3.X == 1 ? 1 : N3.X - 1, N3.Y == 1 ? 1 : N3.Y - 1, N3.Z == 1 ? 1 : N3.Z - 1);
  // printf("M3 = " idx2_PrStrV3i "\n", idx2_PrV3i(M3));
  idx2_Assert(IsPow2(M3.X) && IsPow2(M3.Y) && IsPow2(M3.Z));
  int NLevels = Log2Floor(Max(Max(N3.X, N3.Y), N3.Z));
  ForwardCdf53(Dims3, M3, 0, NLevels, TransformOrder, Vol);
  InverseCdf53(N3, M3, 0, NLevels, TransformOrder, Vol);
}